

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O1

void SzAr_Free(CSzAr *p,ISzAlloc *alloc)

{
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->PackPositions);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->FolderCRCs).Defs);
  (p->FolderCRCs).Defs = (Byte *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,(p->FolderCRCs).Vals);
  (p->FolderCRCs).Vals = (UInt32 *)0x0;
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FoCodersOffsets);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FoStartPackStreamIndex);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FoToCoderUnpackSizes);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->FoToMainUnpackSizeIndex);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->CoderUnpackSizes);
  (*SZIP_SzAlloc.Free)(&SZIP_SzAlloc,p->CodersData);
  p->CoderUnpackSizes = (UInt64 *)0x0;
  p->CodersData = (Byte *)0x0;
  p->FoToCoderUnpackSizes = (UInt32 *)0x0;
  p->FoToMainUnpackSizeIndex = (Byte *)0x0;
  p->FoCodersOffsets = (size_t *)0x0;
  p->FoStartPackStreamIndex = (UInt32 *)0x0;
  (p->FolderCRCs).Defs = (Byte *)0x0;
  (p->FolderCRCs).Vals = (UInt32 *)0x0;
  p->NumPackStreams = 0;
  p->NumFolders = 0;
  p->PackPositions = (UInt64 *)0x0;
  return;
}

Assistant:

static void SzAr_Free(CSzAr *p, ISzAlloc *alloc)
{
  IAlloc_Free(alloc, p->PackPositions);
  SzBitUi32s_Free(&p->FolderCRCs, alloc);
 
  IAlloc_Free(alloc, p->FoCodersOffsets);
  IAlloc_Free(alloc, p->FoStartPackStreamIndex);
  IAlloc_Free(alloc, p->FoToCoderUnpackSizes);
  IAlloc_Free(alloc, p->FoToMainUnpackSizeIndex);
  IAlloc_Free(alloc, p->CoderUnpackSizes);
  
  IAlloc_Free(alloc, p->CodersData);

  SzAr_Init(p);
}